

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

FunctionDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionDeclarationSyntax,slang::syntax::FunctionDeclarationSyntax_const&>
          (BumpAllocator *this,FunctionDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  FunctionDeclarationSyntax *pFVar9;
  
  pFVar9 = (FunctionDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FunctionDeclarationSyntax *)this->endPtr < pFVar9 + 1) {
    pFVar9 = (FunctionDeclarationSyntax *)allocateSlow(this,0xb8,8);
  }
  else {
    this->head->current = (byte *)(pFVar9 + 1);
  }
  (pFVar9->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pFVar9->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar9->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pFVar9->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pFVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pFVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pFVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pFVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pFVar9->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pFVar9->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pFVar9->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pFVar9->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pFVar9->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005bad98;
  TVar5 = (args->semi).kind;
  uVar6 = (args->semi).field_0x2;
  NVar7.raw = (args->semi).numFlags.raw;
  uVar8 = (args->semi).rawLen;
  (pFVar9->prototype).ptr = (args->prototype).ptr;
  (pFVar9->semi).kind = TVar5;
  (pFVar9->semi).field_0x2 = uVar6;
  (pFVar9->semi).numFlags = (NumericTokenFlags)NVar7.raw;
  (pFVar9->semi).rawLen = uVar8;
  (pFVar9->semi).info = (args->semi).info;
  uVar4 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pFVar9->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pFVar9->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pFVar9->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pFVar9->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pFVar9->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pFVar9->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  sVar2 = (args->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pFVar9->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr =
       (args->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr;
  (pFVar9->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pFVar9->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005bb0b8;
  uVar6 = (args->end).field_0x2;
  NVar7.raw = (args->end).numFlags.raw;
  uVar8 = (args->end).rawLen;
  pIVar3 = (args->end).info;
  (pFVar9->end).kind = (args->end).kind;
  (pFVar9->end).field_0x2 = uVar6;
  (pFVar9->end).numFlags = (NumericTokenFlags)NVar7.raw;
  (pFVar9->end).rawLen = uVar8;
  (pFVar9->end).info = pIVar3;
  pFVar9->endBlockName = args->endBlockName;
  return pFVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }